

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
 __thiscall
utf8::
utf8to16<std::back_insert_iterator<std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (utf8 *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,
          back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          result)

{
  uint32_t uVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  local_28._M_current = (char *)this;
  if (this < start._M_current) {
    do {
      uVar1 = next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(&local_28,start);
      if (0xffff < uVar1) {
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::push_back((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *
                    )end._M_current,(short)(uVar1 >> 10) + L'ퟀ');
        uVar1 = uVar1 & 0x3ff | 0xdc00;
      }
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                end._M_current,(char16_t)uVar1);
    } while (local_28._M_current < start._M_current);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          )(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
           end._M_current;
}

Assistant:

u16bit_iterator utf8to16 (octet_iterator start, octet_iterator end, u16bit_iterator result)
    {
        while (start < end) {
            uint32_t cp = utf8::next(start, end);
            if (cp > 0xffff) { //make a surrogate pair
                *result++ = static_cast<uint16_t>((cp >> 10)   + internal::LEAD_OFFSET);
                *result++ = static_cast<uint16_t>((cp & 0x3ff) + internal::TRAIL_SURROGATE_MIN);
            }
            else
                *result++ = static_cast<uint16_t>(cp);
        }
        return result;
    }